

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_HVC(DisasContext_conflict1 *s,arg_HVC *a)

{
  TCGContext_conflict1 *pTVar1;
  TCGContext_conflict1 *tcg_ctx;
  uint uVar2;
  TCGTemp *local_28;
  
  uVar2 = (uint)s->features & 0x220;
  if (uVar2 == 0x20) {
    if (s->user == 0) {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->cpu_R[0xf] + (long)pTVar1),
                          (long)(int)s->pc_curr);
      local_28 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
      tcg_gen_callN_aarch64(pTVar1,helper_pre_hvc_aarch64,(TCGTemp *)0x0,1,&local_28);
      s->svc_imm = (uint32_t)a;
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->cpu_R[0xf] + (long)pTVar1),
                          (long)(int)(s->base).pc_next);
      (s->base).is_jmp = DISAS_TARGET_5;
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return uVar2 == 0x20;
}

Assistant:

static bool trans_HVC(DisasContext *s, arg_HVC *a)
{
    if (!ENABLE_ARCH_7 || arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    if (IS_USER(s)) {
        unallocated_encoding(s);
    } else {
        gen_hvc(s, a->imm);
    }
    return true;
}